

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setWindowModality(QMessageBox *this,WindowModality windowModality)

{
  QWidget *pQVar1;
  int in_ESI;
  QMessageBox *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000088;
  QWidget *in_stack_00000090;
  WindowFlags in_stack_000001d0;
  undefined8 in_stack_ffffffffffffffc8;
  WindowModality windowModality_00;
  QWidget *in_stack_ffffffffffffffd0;
  QPushButton *button;
  
  windowModality_00 = (WindowModality)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  button = *(QPushButton **)(in_FS_OFFSET + 0x28);
  QWidget::setWindowModality(in_stack_ffffffffffffffd0,windowModality_00);
  pQVar1 = QWidget::parentWidget((QWidget *)0x7a88ac);
  if ((pQVar1 == (QWidget *)0x0) || (in_ESI != 1)) {
    pQVar1 = QWidget::parentWidget((QWidget *)0x7a88f6);
    QFlags<Qt::WindowType>::QFlags
              ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffffd0,
               (WindowType)((ulong)pQVar1 >> 0x20));
    QWidget::setParent(in_stack_00000090,in_stack_00000088,in_stack_000001d0);
  }
  else {
    pQVar1 = QWidget::parentWidget((QWidget *)0x7a88c3);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)pQVar1,windowModality_00);
    QWidget::setParent(in_stack_00000090,in_stack_00000088,in_stack_000001d0);
  }
  d_func((QMessageBox *)0x7a8925);
  setDefaultButton(in_RDI,button);
  if (*(QPushButton **)(in_FS_OFFSET + 0x28) == button) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setWindowModality(Qt::WindowModality windowModality)
{
    QDialog::setWindowModality(windowModality);

    if (parentWidget() && windowModality == Qt::WindowModal)
        setParent(parentWidget(), Qt::Sheet);
    else
        setParent(parentWidget(), Qt::Dialog);
    setDefaultButton(d_func()->defaultButton);
}